

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_23::TapAssertionPrinter::printResultType
          (TapAssertionPrinter *this,StringRef passOrFail)

{
  ostream *poVar1;
  char local_9;
  
  if (passOrFail.m_size != 0) {
    poVar1 = (ostream *)std::ostream::write((char *)this->stream,(long)passOrFail.m_start);
    local_9 = ' ';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_9,1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," -",2);
  }
  return;
}

Assistant:

constexpr auto empty() const noexcept -> bool {
            return m_size == 0;
        }